

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TextWrappedV(char *fmt,__va_list_tag *args)

{
  float fVar1;
  uint uVar2;
  undefined8 *puVar3;
  
  fVar1 = (GImGui->CurrentWindow->DC).TextWrapPos;
  if (fVar1 < 0.0) {
    PushTextWrapPos(0.0);
  }
  if (((*fmt == '%') && (fmt[1] == 's')) && (fmt[2] == '\0')) {
    uVar2 = args->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar3 = (undefined8 *)((ulong)uVar2 + (long)args->reg_save_area);
      args->gp_offset = uVar2 + 8;
    }
    else {
      puVar3 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar3 + 1;
    }
    TextEx((char *)*puVar3,(char *)0x0,1);
  }
  else {
    TextV(fmt,args);
  }
  if (fVar1 < 0.0) {
    PopTextWrapPos();
    return;
  }
  return;
}

Assistant:

void ImGui::TextWrappedV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    bool need_backup = (g.CurrentWindow->DC.TextWrapPos < 0.0f);  // Keep existing wrap position if one is already set
    if (need_backup)
        PushTextWrapPos(0.0f);
    if (fmt[0] == '%' && fmt[1] == 's' && fmt[2] == 0)
        TextEx(va_arg(args, const char*), NULL, ImGuiTextFlags_NoWidthForLargeClippedText); // Skip formatting
    else
        TextV(fmt, args);
    if (need_backup)
        PopTextWrapPos();
}